

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

ProcessorAliasDeclaration * __thiscall
soul::PoolAllocator::
allocate<soul::AST::ProcessorAliasDeclaration,soul::AST::Context&,soul::Identifier>
          (PoolAllocator *this,Context *args,Identifier *args_1)

{
  DestructorFn *pDVar1;
  Context *this_00;
  _lambda_void___1_ local_39;
  string *local_38;
  ProcessorAliasDeclaration *local_30;
  ProcessorAliasDeclaration *newObject;
  PoolItem *newItem;
  Identifier *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_1;
  args_local_1 = (Identifier *)args;
  args_local = (Context *)this;
  newObject = (ProcessorAliasDeclaration *)allocateSpaceForObject(this,0x40);
  this_00 = &(newObject->super_ASTObject).context;
  local_38 = (string *)newItem->size;
  AST::ProcessorAliasDeclaration::ProcessorAliasDeclaration
            ((ProcessorAliasDeclaration *)this_00,(Context *)args_local_1,(Identifier)local_38);
  local_30 = (ProcessorAliasDeclaration *)this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::Identifier&&)::{lambda(void*)#1}::
           operator_cast_to_function_pointer(&local_39);
  *(DestructorFn **)&(newObject->super_ASTObject).objectType = pDVar1;
  return local_30;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }